

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

void ImageResizeCanvas(Image *image,int newWidth,int newHeight,int offsetX,int offsetY,Color fill)

{
  int iVar1;
  int iVar2;
  void *dstPtr;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  void *pvVar7;
  size_t __n;
  float fVar8;
  float fVar9;
  float fVar10;
  float local_80;
  float local_70;
  long local_60;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    iVar4 = image->format;
    if (0xd < iVar4) {
      TraceLog(4,"Image manipulation not supported for compressed formats");
      return;
    }
    iVar1 = image->width;
    iVar2 = image->height;
    if (iVar2 != newHeight || iVar1 != newWidth) {
      fVar10 = (float)iVar1;
      fVar9 = (float)offsetX;
      if (offsetX < 0) {
        fVar10 = fVar10 + fVar9;
        lVar6 = (long)(int)(float)-offsetX;
        fVar9 = 0.0;
      }
      else {
        if (newWidth < iVar1 + offsetX) {
          fVar10 = (float)(newWidth - offsetX);
        }
        lVar6 = 0;
      }
      local_80 = (float)iVar2;
      local_70 = (float)offsetY;
      if (offsetY < 0) {
        local_80 = local_80 + local_70;
        local_60 = (long)(int)(float)-offsetY;
        local_70 = 0.0;
      }
      else {
        if (newHeight < iVar2 + offsetY) {
          local_80 = (float)(newHeight - offsetY);
        }
        local_60 = 0;
      }
      iVar2 = GetPixelDataSize(1,1,iVar4);
      dstPtr = calloc((long)(newHeight * newWidth * iVar2),1);
      SetPixelColor(dstPtr,fill,iVar4);
      __n = (size_t)iVar2;
      pvVar7 = dstPtr;
      for (lVar5 = 1; pvVar7 = (void *)(__n + (long)pvVar7), lVar5 < newWidth; lVar5 = lVar5 + 1) {
        memcpy(pvVar7,dstPtr,__n);
      }
      fVar8 = (float)newWidth;
      if (fVar10 <= (float)newWidth) {
        fVar8 = fVar10;
      }
      iVar3 = iVar2 * newWidth;
      iVar4 = iVar3;
      for (lVar5 = 1; lVar5 < newHeight; lVar5 = lVar5 + 1) {
        memcpy((void *)((long)iVar4 + (long)dstPtr),dstPtr,(long)iVar3);
        iVar4 = iVar4 + iVar3;
      }
      fVar10 = (float)newHeight;
      if (local_80 <= (float)newHeight) {
        fVar10 = local_80;
      }
      lVar5 = (lVar6 + local_60 * iVar1) * __n;
      pvVar7 = (void *)((long)dstPtr + (long)(((int)fVar9 + (int)local_70 * newWidth) * iVar2));
      for (lVar6 = 0; lVar6 < (int)fVar10; lVar6 = lVar6 + 1) {
        memcpy(pvVar7,(void *)((long)image->data + lVar5),(long)((int)fVar8 * iVar2));
        lVar5 = lVar5 + __n * (long)iVar1;
        pvVar7 = (void *)((long)pvVar7 + (long)iVar3);
      }
      free(image->data);
      image->data = dstPtr;
      image->width = newWidth;
      image->height = newHeight;
    }
  }
  return;
}

Assistant:

void ImageResizeCanvas(Image *image, int newWidth, int newHeight, int offsetX, int offsetY, Color fill)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else if ((newWidth != image->width) || (newHeight != image->height))
    {
        Rectangle srcRec = { 0, 0, (float)image->width, (float)image->height };
        Vector2 dstPos = { (float)offsetX, (float)offsetY };

        if (offsetX < 0)
        {
            srcRec.x = (float)-offsetX;
            srcRec.width += (float)offsetX;
            dstPos.x = 0;
        }
        else if ((offsetX + image->width) > newWidth) srcRec.width = (float)(newWidth - offsetX);

        if (offsetY < 0)
        {
            srcRec.y = (float)-offsetY;
            srcRec.height += (float)offsetY;
            dstPos.y = 0;
        }
        else if ((offsetY + image->height) > newHeight) srcRec.height = (float)(newHeight - offsetY);

        if (newWidth < srcRec.width) srcRec.width = (float)newWidth;
        if (newHeight < srcRec.height) srcRec.height = (float)newHeight;

        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *resizedData = (unsigned char *)RL_CALLOC(newWidth*newHeight*bytesPerPixel, 1);

        // Fill resized canvas with fill color
        // Set first pixel with image->format
        SetPixelColor(resizedData, fill, image->format);

        // Fill remaining bytes of first row
        for (int x = 1; x < newWidth; x++)
        {
            memcpy(resizedData + x*bytesPerPixel, resizedData, bytesPerPixel);
        }
        // Copy the first row into the other rows
        for (int y = 1; y < newHeight; y++)
        {
            memcpy(resizedData + y*newWidth*bytesPerPixel, resizedData, newWidth*bytesPerPixel);
        }

        // Copy old image to resized canvas
        int dstOffsetSize = ((int)dstPos.y*newWidth + (int)dstPos.x)*bytesPerPixel;

        for (int y = 0; y < (int)srcRec.height; y++)
        {
            memcpy(resizedData + dstOffsetSize, ((unsigned char *)image->data) + ((y + (int)srcRec.y)*image->width + (int)srcRec.x)*bytesPerPixel, (int)srcRec.width*bytesPerPixel);
            dstOffsetSize += (newWidth*bytesPerPixel);
        }

        RL_FREE(image->data);
        image->data = resizedData;
        image->width = newWidth;
        image->height = newHeight;
    }
}